

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O1

void __thiscall amrex::MLMG::mgVcycle(MLMG *this,int amrlev,int mglev_top)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ostringstream *poVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  Print local_1b8;
  
  iVar8 = (this->linop->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [amrlev];
  uVar9 = (long)iVar8 - 1;
  iVar4 = (int)uVar9;
  if (mglev_top < iVar4) {
    uVar5 = (ulong)mglev_top;
    do {
      poVar10 = &local_1b8.ss;
      if (3 < this->verbose) {
        (*this->linop->_vptr_MLLinOp[0x32])
                  (this->linop,
                   uVar5 * 8 +
                   *(long *)&(this->res).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[amrlev].
                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
        local_1b8.os = OutStream();
        local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
        local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar10);
        *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
             *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"AT LEVEL ",9);
        std::ostream::operator<<(poVar10,amrlev);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10," ",1);
        std::ostream::operator<<(poVar10,(int)uVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar10,"   DN: Norm before smooth ",0x1a);
        std::ostream::_M_insert<double>(extraout_XMM0_Qa);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"\n",1);
        Print::~Print(&local_1b8);
      }
      lVar6 = uVar5 * 8;
      (*this->linop->_vptr_MLLinOp[0x2e])
                (this->linop,
                 *(long *)&(this->cor).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[amrlev].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6);
      if (0 < this->nu1) {
        uVar3 = 1;
        iVar7 = 0;
        do {
          (*this->linop->_vptr_MLLinOp[0x39])
                    (this->linop,amrlev,uVar5 & 0xffffffff,
                     *(long *)&(this->cor).
                               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[amrlev].
                               super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,
                     *(long *)&(this->res).
                               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[amrlev].
                               super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,
                     (ulong)uVar3);
          iVar7 = iVar7 + 1;
          uVar3 = 0;
        } while (iVar7 < this->nu1);
      }
      (*this->linop->_vptr_MLLinOp[0x35])
                (this->linop,amrlev,uVar5 & 0xffffffff,
                 *(long *)&(this->rescor).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[amrlev].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,
                 *(long *)&(this->cor).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[amrlev].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,
                 *(long *)&(this->res).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[amrlev].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,0,0);
      if (3 < this->verbose) {
        (*this->linop->_vptr_MLLinOp[0x32])
                  (this->linop,
                   *(long *)&(this->rescor).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[amrlev].
                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6);
        local_1b8.os = OutStream();
        local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
        local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
        poVar10 = &local_1b8.ss;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar10);
        *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
             *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"AT LEVEL ",9);
        std::ostream::operator<<(poVar10,amrlev);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10," ",1);
        std::ostream::operator<<(poVar10,(int)uVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar10,"   DN: Norm after  smooth ",0x1a);
        std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"\n",1);
        Print::~Print(&local_1b8);
      }
      lVar1 = uVar5 * 8;
      uVar5 = uVar5 + 1;
      (*this->linop->_vptr_MLLinOp[0x3a])
                (this->linop,amrlev,uVar5 & 0xffffffff,
                 lVar1 + 8 +
                 *(long *)&(this->res).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[amrlev].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>,
                 lVar6 + *(long *)&(this->rescor).
                                   super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                   .
                                   super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                   super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
    } while (uVar5 != uVar9);
  }
  if (amrlev == 0) {
    if (3 < this->verbose) {
      (*this->linop->_vptr_MLLinOp[0x32])
                (this->linop,
                 (long)iVar4 * 8 +
                 *(long *)&(this->res).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[amrlev].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
      local_1b8.os = OutStream();
      local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
      poVar10 = &local_1b8.ss;
      local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar10);
      *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
           *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"AT LEVEL ",9);
      std::ostream::operator<<(poVar10,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10," ",1);
      std::ostream::operator<<(poVar10,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar10,"   DN: Norm before bottom ",0x1a);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_03);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"\n",1);
      Print::~Print(&local_1b8);
    }
    bottomSolve(this);
    if (this->verbose < 4) goto LAB_0064d703;
    lVar6 = (long)iVar4 * 8;
    (*this->linop->_vptr_MLLinOp[0x35])
              (this->linop,0,uVar9 & 0xffffffff,
               *(long *)&(this->rescor).
                         super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                         super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,
               *(long *)&(this->cor).
                         super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                         super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,
               *(long *)&(this->res).
                         super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                         super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,0,0);
    (*this->linop->_vptr_MLLinOp[0x32])
              (this->linop,
               lVar6 + *(long *)&(this->rescor).
                                 super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                 super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
    local_1b8.os = OutStream();
    local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
    poVar10 = &local_1b8.ss;
    local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar10);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"AT LEVEL ",9);
    std::ostream::operator<<(poVar10,0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10," ",1);
    std::ostream::operator<<(poVar10,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar10,"   UP: Norm after  bottom ",0x1a);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_04);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"\n",1);
  }
  else {
    if (3 < this->verbose) {
      (*this->linop->_vptr_MLLinOp[0x32])
                (this->linop,
                 (long)iVar4 * 8 +
                 *(long *)&(this->res).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[amrlev].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
      local_1b8.os = OutStream();
      local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
      poVar10 = &local_1b8.ss;
      local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar10);
      *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
           *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"AT LEVEL ",9);
      std::ostream::operator<<(poVar10,amrlev);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10," ",1);
      std::ostream::operator<<(poVar10,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar10,"       Norm before smooth ",0x1a);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_01);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"\n",1);
      Print::~Print(&local_1b8);
    }
    lVar6 = (long)iVar4 * 8;
    (*this->linop->_vptr_MLLinOp[0x2e])
              (this->linop,
               *(long *)&(this->cor).
                         super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                         super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6);
    if (0 < this->nu1) {
      uVar3 = 1;
      iVar7 = 0;
      do {
        (*this->linop->_vptr_MLLinOp[0x39])
                  (this->linop,amrlev,uVar9 & 0xffffffff,
                   *(long *)&(this->cor).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[amrlev].
                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,
                   *(long *)&(this->res).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[amrlev].
                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,
                   (ulong)uVar3);
        iVar7 = iVar7 + 1;
        uVar3 = 0;
      } while (iVar7 < this->nu1);
    }
    if (this->verbose < 4) goto LAB_0064d703;
    (*this->linop->_vptr_MLLinOp[0x35])
              (this->linop,amrlev,uVar9 & 0xffffffff,
               *(long *)&(this->rescor).
                         super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                         super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,
               *(long *)&(this->cor).
                         super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                         super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,
               *(long *)&(this->res).
                         super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                         super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,0,0);
    (*this->linop->_vptr_MLLinOp[0x32])
              (this->linop,
               lVar6 + *(long *)&(this->rescor).
                                 super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                 super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
    local_1b8.os = OutStream();
    local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
    poVar10 = &local_1b8.ss;
    local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar10);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"AT LEVEL ",9);
    std::ostream::operator<<(poVar10,amrlev);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10," ",1);
    std::ostream::operator<<(poVar10,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar10,"       Norm after  smooth ",0x1a);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_02);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"\n",1);
  }
  Print::~Print(&local_1b8);
LAB_0064d703:
  if (mglev_top < iVar4) {
    uVar9 = (long)(iVar8 + -2);
    do {
      poVar10 = &local_1b8.ss;
      iVar8 = (int)uVar9;
      addInterpCorrection(this,amrlev,iVar8);
      if (3 < this->verbose) {
        lVar6 = uVar9 * 8;
        (*this->linop->_vptr_MLLinOp[0x35])
                  (this->linop,amrlev,uVar9 & 0xffffffff,
                   *(long *)&(this->rescor).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[amrlev].
                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,
                   *(long *)&(this->cor).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[amrlev].
                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,
                   *(long *)&(this->res).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[amrlev].
                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,0,0
                  );
        (*this->linop->_vptr_MLLinOp[0x32])
                  (this->linop,
                   lVar6 + *(long *)&(this->rescor).
                                     super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                     super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                     super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
        local_1b8.os = OutStream();
        local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
        local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar10);
        *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
             *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"AT LEVEL ",9);
        std::ostream::operator<<(poVar10,amrlev);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10," ",1);
        std::ostream::operator<<(poVar10,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar10,"   UP: Norm before smooth ",0x1a);
        std::ostream::_M_insert<double>(extraout_XMM0_Qa_05);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"\n",1);
        Print::~Print(&local_1b8);
      }
      if (0 < this->nu2) {
        iVar4 = 0;
        do {
          (*this->linop->_vptr_MLLinOp[0x39])
                    (this->linop,amrlev,uVar9 & 0xffffffff,
                     *(long *)&(this->cor).
                               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[amrlev].
                               super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> +
                     uVar9 * 8,
                     *(long *)&(this->res).
                               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[amrlev].
                               super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> +
                     uVar9 * 8,0);
          iVar4 = iVar4 + 1;
        } while (iVar4 < this->nu2);
      }
      if (this->cf_strategy == ghostnodes) {
        lVar6 = uVar9 * 8;
        (*this->linop->_vptr_MLLinOp[0x35])
                  (this->linop,amrlev,uVar9 & 0xffffffff,
                   lVar6 + *(long *)&(this->rescor).
                                     super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                     super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                     super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>,
                   *(long *)&(this->cor).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[amrlev].
                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,
                   *(long *)&(this->res).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[amrlev].
                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,0,0
                  );
      }
      if (3 < this->verbose) {
        lVar6 = uVar9 * 8;
        (*this->linop->_vptr_MLLinOp[0x35])
                  (this->linop,amrlev,uVar9 & 0xffffffff,
                   *(long *)&(this->rescor).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[amrlev].
                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,
                   *(long *)&(this->cor).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[amrlev].
                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,
                   *(long *)&(this->res).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[amrlev].
                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6,0,0
                  );
        poVar10 = &local_1b8.ss;
        (*this->linop->_vptr_MLLinOp[0x32])
                  (this->linop,
                   lVar6 + *(long *)&(this->rescor).
                                     super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                     super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                     super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
        local_1b8.os = OutStream();
        local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
        local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar10);
        *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
             *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"AT LEVEL ",9);
        std::ostream::operator<<(poVar10,amrlev);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10," ",1);
        std::ostream::operator<<(poVar10,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar10,"   UP: Norm after  smooth ",0x1a);
        std::ostream::_M_insert<double>(extraout_XMM0_Qa_06);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"\n",1);
        Print::~Print(&local_1b8);
      }
      bVar2 = (long)mglev_top < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void
MLMG::mgVcycle (int amrlev, int mglev_top)
{
    BL_PROFILE("MLMG::mgVcycle()");

    const int mglev_bottom = linop.NMGLevels(amrlev) - 1;

    for (int mglev = mglev_top; mglev < mglev_bottom; ++mglev)
    {
        BL_PROFILE_VAR("MLMG::mgVcycle_down::"+std::to_string(mglev), blp_mgv_down_lev);

        if (verbose >= 4)
        {
            Real norm = linop.AnyNormInf(res[amrlev][mglev]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev
                           << "   DN: Norm before smooth " << norm << "\n";
        }

        linop.AnySetToZero(cor[amrlev][mglev]);
        bool skip_fillboundary = true;
        for (int i = 0; i < nu1; ++i) {
            linop.AnySmooth(amrlev, mglev, cor[amrlev][mglev], res[amrlev][mglev],
                            skip_fillboundary);
            skip_fillboundary = false;
        }

        // rescor = res - L(cor)
        computeResOfCorrection(amrlev, mglev);

        if (verbose >= 4)
        {
            Real norm = linop.AnyNormInf(rescor[amrlev][mglev]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev
                           << "   DN: Norm after  smooth " << norm << "\n";
        }

        // res_crse = R(rescor_fine); this provides res/b to the level below
        linop.AnyRestriction(amrlev, mglev+1, res[amrlev][mglev+1], rescor[amrlev][mglev]);
    }

    BL_PROFILE_VAR("MLMG::mgVcycle_bottom", blp_bottom);
    if (amrlev == 0)
    {
        if (verbose >= 4)
        {
            Real norm = linop.AnyNormInf(res[amrlev][mglev_bottom]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev_bottom
                           << "   DN: Norm before bottom " << norm << "\n";
        }
        bottomSolve();
        if (verbose >= 4)
        {
            computeResOfCorrection(amrlev, mglev_bottom);
            Real norm = linop.AnyNormInf(rescor[amrlev][mglev_bottom]);

            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev_bottom
                           << "   UP: Norm after  bottom " << norm << "\n";
        }
    }
    else
    {
        if (verbose >= 4)
        {
            Real norm = linop.AnyNormInf(res[amrlev][mglev_bottom]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev_bottom
                           << "       Norm before smooth " << norm << "\n";
        }
        linop.AnySetToZero(cor[amrlev][mglev_bottom]);
        bool skip_fillboundary = true;
        for (int i = 0; i < nu1; ++i) {
            linop.AnySmooth(amrlev, mglev_bottom, cor[amrlev][mglev_bottom],
                            res[amrlev][mglev_bottom], skip_fillboundary);
            skip_fillboundary = false;
        }
        if (verbose >= 4)
        {
            computeResOfCorrection(amrlev, mglev_bottom);
            Real norm = linop.AnyNormInf(rescor[amrlev][mglev_bottom]);
            amrex::Print() << "AT LEVEL "  << amrlev  << " " << mglev_bottom
                           << "       Norm after  smooth " << norm << "\n";
        }
    }
    BL_PROFILE_VAR_STOP(blp_bottom);

    for (int mglev = mglev_bottom-1; mglev >= mglev_top; --mglev)
    {
        BL_PROFILE_VAR("MLMG::mgVcycle_up::"+std::to_string(mglev), blp_mgv_up_lev);
        // cor_fine += I(cor_crse)
        addInterpCorrection(amrlev, mglev);
        if (verbose >= 4)
        {
            computeResOfCorrection(amrlev, mglev);
            Real norm = linop.AnyNormInf(rescor[amrlev][mglev]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev
                           << "   UP: Norm before smooth " << norm << "\n";
        }
        for (int i = 0; i < nu2; ++i) {
            linop.AnySmooth(amrlev, mglev, cor[amrlev][mglev], res[amrlev][mglev]);
        }

        if (cf_strategy == CFStrategy::ghostnodes) computeResOfCorrection(amrlev, mglev);

        if (verbose >= 4)
        {
            computeResOfCorrection(amrlev, mglev);
            Real norm = linop.AnyNormInf(rescor[amrlev][mglev]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev
                           << "   UP: Norm after  smooth " << norm << "\n";
        }
    }
}